

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::WaterTypeVisitor::visit(WaterTypeVisitor *this,RigidBody *rb)

{
  element_type *propName;
  iterator iVar1;
  WaterTypeVisitor *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::GenericData> data;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> myAtoms;
  iterator i;
  string rbName;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_98;
  undefined8 local_78;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_70;
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_78 = 0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_ptr = (element_type *)0x0;
  local_c8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(&local_70);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->waterTypeList)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->waterTypeList)._M_t._M_impl.super__Rb_tree_header)
  {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector(&local_70,&rb->atoms_);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::_M_move_assign
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_98,
               (WaterTypeVisitor *)&local_70);
    std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base
              ((_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&local_70);
    for (p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_98._M_impl.super__Vector_impl_data._M_start;
        p_Var2 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_98._M_impl.super__Vector_impl_data._M_finish; p_Var2 = p_Var2 + 1) {
      propName = ((__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)&p_Var2->_M_pi)->
                 _M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"ATOMDATA",(allocator<char> *)local_b8);
      StuntDouble::getPropertyByName((StuntDouble *)(local_b8 + 0x10),&propName->atomTypeName);
      std::__cxx11::string::~string((string *)&local_70);
      if (local_b8._16_8_ != 0) {
        std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
                  ((shared_ptr<OpenMD::GenericData> *)&local_70);
        std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_c8,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_70
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_70.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
        if ((WaterTypeVisitor *)local_c8._M_ptr != (WaterTypeVisitor *)0x0) {
          this_00 = (WaterTypeVisitor *)local_c8._M_ptr;
          AtomData::beginAtomInfo((AtomData *)local_b8,(iterator *)local_c8._M_ptr);
          while ((string *)local_b8._0_8_ != (string *)0x0) {
            trimmedName((string *)&local_70,this_00,(string *)local_b8._0_8_);
            std::__cxx11::string::operator=((string *)local_b8._0_8_,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            AtomData::nextAtomInfo((AtomData *)&local_70,(iterator *)local_c8._M_ptr);
            this_00 = (WaterTypeVisitor *)&local_70;
            std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_b8,
                       (__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_70);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_70.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::_Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void WaterTypeVisitor::visit(RigidBody* rb) {
    std::string rbName;
    std::vector<Atom*> myAtoms;
    std::vector<Atom*>::iterator atomIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    std::shared_ptr<AtomData> atomData;

    rbName = rb->getType();

    if (waterTypeList.find(rbName) != waterTypeList.end()) {
      myAtoms = rb->getAtoms();

      for (atomIter = myAtoms.begin(); atomIter != myAtoms.end(); ++atomIter) {
        std::shared_ptr<GenericData> data =
            (*atomIter)->getPropertyByName("ATOMDATA");

        if (data != nullptr) {
          atomData = std::dynamic_pointer_cast<AtomData>(data);

          if (atomData == nullptr) continue;
        } else
          continue;

        for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
             atomInfo; atomInfo                 = atomData->nextAtomInfo(i)) {
          atomInfo->atomTypeName = trimmedName(atomInfo->atomTypeName);
        }
      }
    }
  }